

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.cpp
# Opt level: O2

void __thiscall booster::streambuf::~streambuf(streambuf *this)

{
  *(undefined ***)this = &PTR__streambuf_001d92f8;
  std::unique_ptr<booster::io_device,_std::default_delete<booster::io_device>_>::~unique_ptr
            (&this->device_unique_ptr_);
  hold_ptr<booster::streambuf::_data>::~hold_ptr(&this->d);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->buffer_in_).super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->buffer_out_).super__Vector_base<char,_std::allocator<char>_>);
  std::streambuf::~streambuf(this);
  return;
}

Assistant:

streambuf::~streambuf()
	{
	}